

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O1

FT_Error T42_GlyphSlot_Init(FT_GlyphSlot t42slot)

{
  FT_Face pFVar1;
  FT_Memory memory;
  FT_Library pFVar2;
  FT_Error FVar3;
  FT_GlyphSlot *ppFVar4;
  FT_GlyphSlot ttslot;
  FT_GlyphSlot local_28;
  
  ppFVar4 = &local_28;
  pFVar1 = t42slot->face;
  memory = pFVar1->memory;
  if (pFVar1->glyph == (FT_GlyphSlot)0x0) {
    ppFVar4 = &((FT_Face)pFVar1[3].available_sizes)->glyph;
  }
  else {
    FVar3 = FT_New_GlyphSlot((FT_Face)pFVar1[3].available_sizes,&local_28);
    if (FVar3 != 0) goto LAB_00267da3;
  }
  t42slot[1].library = (FT_Library)*ppFVar4;
  FVar3 = 0;
LAB_00267da3:
  FT_GlyphLoader_Done((FT_GlyphLoader)((t42slot[1].library)->cur_renderer->root).clazz);
  ft_mem_free(memory,(t42slot[1].library)->cur_renderer);
  pFVar2 = t42slot[1].library;
  pFVar2->cur_renderer = (FT_Renderer_conflict)0x0;
  pFVar2->cur_renderer = (FT_Renderer_conflict)t42slot->internal;
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_GlyphSlot_Init( FT_GlyphSlot  t42slot )        /* T42_GlyphSlot */
  {
    T42_GlyphSlot  slot    = (T42_GlyphSlot)t42slot;
    FT_Face        face    = t42slot->face;
    T42_Face       t42face = (T42_Face)face;
    FT_GlyphSlot   ttslot;
    FT_Memory      memory  = face->memory;
    FT_Error       error   = FT_Err_Ok;


    if ( !face->glyph )
    {
      /* First glyph slot for this face */
      slot->ttslot = t42face->ttf_face->glyph;
    }
    else
    {
      error = FT_New_GlyphSlot( t42face->ttf_face, &ttslot );
      if ( !error )
        slot->ttslot = ttslot;
    }

    /* share the loader so that the autohinter can see it */
    FT_GlyphLoader_Done( slot->ttslot->internal->loader );
    FT_FREE( slot->ttslot->internal );
    slot->ttslot->internal = t42slot->internal;

    return error;
  }